

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void SparseKeygenRecurse<Blob<4096>,unsigned_long>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<4096> *k,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  undefined1 in_CL;
  int in_EDX;
  uint32_t in_ESI;
  code *in_RDI;
  void *in_R8;
  Blob<4096> *in_R9;
  int i;
  unsigned_long h;
  int nbits;
  int nbytes;
  uint32_t local_3c;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 uVar2;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint start_00;
  
  start_00 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  uVar2 = 0x200;
  uVar1 = 0x1000;
  for (local_3c = in_ESI; (int)local_3c < 0x1000; local_3c = local_3c + 1) {
    flipbit(in_R8,0x200,local_3c);
    if (((start_00 & 0x1000000) != 0) || (in_EDX == 1)) {
      (*in_RDI)(in_R8,0x200,0,&stack0xffffffffffffffc8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(uVar2,uVar1),
                 in_stack_ffffffffffffffc8);
    }
    if (1 < in_EDX) {
      SparseKeygenRecurse<Blob<4096>,unsigned_long>
                ((pfHash)CONCAT44(in_ESI,in_EDX),start_00,in_stack_ffffffffffffffe8,
                 SUB81((ulong)in_R8 >> 0x38,0),in_R9,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(uVar2,uVar1));
    }
    flipbit(in_R8,0x200,local_3c);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}